

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double * normal_01_vector(int n,int *seed)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  lVar4 = (long)n;
  uVar3 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar3 = lVar4 * 8;
  }
  pdVar1 = (double *)operator_new__(uVar3);
  if (n == 1) {
    pdVar2 = r8vec_uniform_01_new(2,seed);
    dVar6 = log(*pdVar2);
    dVar6 = dVar6 * -2.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar7 = cos(pdVar2[1] * 6.283185307179586);
    *pdVar1 = dVar7 * dVar6;
  }
  else if ((n & 1U) == 0) {
    pdVar2 = r8vec_uniform_01_new(n,seed);
    for (lVar4 = 0; lVar4 <= n + -2; lVar4 = lVar4 + 2) {
      dVar6 = log(pdVar2[lVar4]);
      dVar6 = dVar6 * -2.0;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar7 = cos(pdVar2[lVar4 + 1] * 6.283185307179586);
      pdVar1[lVar4] = dVar7 * dVar6;
      dVar6 = log(pdVar2[lVar4]);
      dVar6 = dVar6 * -2.0;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar7 = sin(pdVar2[lVar4 + 1] * 6.283185307179586);
      pdVar1[lVar4 + 1] = dVar7 * dVar6;
    }
    if (pdVar2 == (double *)0x0) {
      return pdVar1;
    }
  }
  else {
    pdVar2 = r8vec_uniform_01_new(n + 1,seed);
    for (lVar5 = 0; lVar5 <= n + -3; lVar5 = lVar5 + 2) {
      dVar6 = log(pdVar2[lVar5]);
      dVar6 = dVar6 * -2.0;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar7 = cos(pdVar2[lVar5 + 1] * 6.283185307179586);
      pdVar1[lVar5] = dVar7 * dVar6;
      dVar6 = log(pdVar2[lVar5]);
      dVar6 = dVar6 * -2.0;
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      dVar7 = sin(pdVar2[lVar5 + 1] * 6.283185307179586);
      pdVar1[lVar5 + 1] = dVar7 * dVar6;
    }
    dVar6 = log(pdVar2[lVar4 + -1]);
    dVar6 = dVar6 * -2.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar7 = cos(pdVar2[lVar4] * 6.283185307179586);
    pdVar1[lVar4 + -1] = dVar7 * dVar6;
  }
  operator_delete__(pdVar2);
  return pdVar1;
}

Assistant:

double *normal_01_vector ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_01_VECTOR samples the standard normal probability distribution.
//
//  Discussion:
//
//    The standard normal probability distribution function (PDF) has
//    mean 0 and standard deviation 1.
//
//    This routine can generate a vector of values on one call.  It
//    has the feature that it should provide the same results
//    in the same order no matter how we break up the task.
//
//    Before calling this routine, the user may call RANDOM_SEED
//    in order to set the seed of the random number generator.
//
//    The Box-Muller method is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of values desired.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double X(N), a sample of the standard normal PDF.
//
//  Local parameters:
//
//    Local, real R(N+1), is used to store some uniform random values.
//    Its dimension is N+1, but really it is only needed to be the
//    smallest even number greater than or equal to N.
//
//    Local, int X_LO, X_HI, records the range of entries of
//    X that we need to compute.  This starts off as 1:N, but is adjusted
//    if we have a saved value that can be immediately stored in X(1),
//    and so on.
//
{
  int i;
  int m;
  const double r8_pi = 3.14159265358979323;
  double *r;
  double *x;
  int x_hi;
  int x_lo;

  x = new double[n];
//
//  Record the range of X we need to fill in.
//
  x_lo = 1;
  x_hi = n;
//
//  If we need just one new value, do that here to avoid null arrays.
//
  if ( x_hi - x_lo + 1 == 1 )
  {
    r = r8vec_uniform_01_new ( 2, seed );

    x[x_hi-1] = sqrt ( -2.0 * log ( r[0] ) ) * cos ( 2.0 * r8_pi * r[1] );

    delete [] r;
  }
//
//  If we require an even number of values, that's easy.
//
  else if ( ( x_hi - x_lo + 1 ) % 2 == 0 )
  {
    m = ( x_hi - x_lo + 1 ) / 2;

    r = r8vec_uniform_01_new ( 2*m, seed );

    for ( i = 0; i <= 2*m-2; i = i + 2 )
    {
      x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );
      x[x_lo+i  ] = sqrt ( -2.0 * log ( r[i] ) ) * sin ( 2.0 * r8_pi * r[i+1] );
    }

    delete [] r;
  }
//
//  If we require an odd number of values, we generate an even number,
//  and handle the last pair specially, storing one in X(N).
//
  else
  {
    x_hi = x_hi - 1;

    m = ( x_hi - x_lo + 1 ) / 2 + 1;

    r = r8vec_uniform_01_new ( 2*m, seed );

    for ( i = 0; i <= 2*m-4; i = i + 2 )
    {
      x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );
      x[x_lo+i  ] = sqrt ( -2.0 * log ( r[i] ) ) * sin ( 2.0 * r8_pi * r[i+1] );
    }

    i = 2*m - 2;

    x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );

    delete [] r;
  }

  return x;
}